

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O1

int luaJIT_setmode(lua_State *L,int idx,int mode)

{
  GCRef *pGVar1;
  uint uVar2;
  TValue *pTVar3;
  global_State *g;
  GCproto *pt;
  
  g = (global_State *)(ulong)(L->glref).ptr32;
  pGVar1 = &g[1].uvhead.field_5.field_1.next;
  pGVar1->gcptr32 = pGVar1->gcptr32 & 0xffffffef;
  if ((g->hookmask & 0x40) != 0) {
    lj_err_caller(L,LJ_ERR_NOGCMM);
  }
  uVar2 = mode & 0xff;
  if (uVar2 < 5) {
    if (uVar2 - 2 < 3) {
      if (idx == 0) {
        pTVar3 = L->base;
        uVar2 = *(uint *)((long)pTVar3 + -4);
        if ((uVar2 & 3) == 0) {
          pTVar3 = pTVar3 + (-2 - (ulong)*(byte *)((ulong)uVar2 - 3));
        }
        else {
          pTVar3 = (TValue *)((long)pTVar3 + (-8 - (long)(int)(uVar2 & 0xfffffff8)));
        }
      }
      else if (idx < 1) {
        pTVar3 = L->top + idx;
      }
      else {
        pTVar3 = L->base + ((ulong)(uint)idx - 1);
      }
      if (((idx == 0) || ((pTVar3->field_2).it == 0xfffffff7)) &&
         (*(char *)((ulong)(pTVar3->u32).lo + 6) == '\0')) {
        pt = (GCproto *)((ulong)*(uint *)((ulong)(pTVar3->u32).lo + 0x10) - 0x40);
      }
      else {
        if ((pTVar3->field_2).it != 0xfffffff8) {
          return 0;
        }
        pt = (GCproto *)(ulong)(pTVar3->u32).lo;
      }
      if (((mode & 0xffU) != 4) && (setptmode(g,pt,mode), (mode & 0xffU) == 2)) {
        return 1;
      }
      setptmode_all(g,pt,mode);
    }
    else {
      if (uVar2 != 0) {
        return 0;
      }
      if (((uint)mode >> 9 & 1) == 0) {
        uVar2 = g[1].strempty.hash;
        if (((uint)mode >> 8 & 1) == 0) {
          uVar2 = uVar2 & 0xfffffffe;
        }
        else {
          if ((uVar2 & 0x20) == 0) {
            return 0;
          }
          uVar2 = uVar2 | 1;
        }
        g[1].strempty.hash = uVar2;
        lj_dispatch_update(g);
      }
      else {
        lj_trace_flushall(L);
      }
    }
  }
  else if (uVar2 == 5) {
    if (((uint)mode >> 9 & 1) == 0) {
      return 0;
    }
    lj_trace_flush((jit_State *)(g + 1),idx);
  }
  else {
    if (uVar2 != 0x10) {
      return 0;
    }
    if (((uint)mode >> 8 & 1) == 0) {
      g->bc_cfunc_ext = 0x5b;
    }
    else {
      if (idx == 0) {
        return 0;
      }
      if (idx < 1) {
        pTVar3 = L->top + idx;
      }
      else {
        pTVar3 = L->base + ((ulong)(uint)idx - 1);
      }
      if (((pTVar3->field_2).it & 0xffff8000) != 0xffff0000) {
        return 0;
      }
      g->wrapf = (lua_CFunction)(pTVar3->u64 & 0x7fffffffffff);
      g->bc_cfunc_ext = 0x5c;
    }
  }
  return 1;
}

Assistant:

int luaJIT_setmode(lua_State *L, int idx, int mode)
{
  global_State *g = G(L);
  int mm = mode & LUAJIT_MODE_MASK;
  lj_trace_abort(g);  /* Abort recording on any state change. */
  /* Avoid pulling the rug from under our own feet. */
  if ((g->hookmask & HOOK_GC))
    lj_err_caller(L, LJ_ERR_NOGCMM);
  switch (mm) {
#if LJ_HASJIT
  case LUAJIT_MODE_ENGINE:
    if ((mode & LUAJIT_MODE_FLUSH)) {
      lj_trace_flushall(L);
    } else {
      if (!(mode & LUAJIT_MODE_ON))
	G2J(g)->flags &= ~(uint32_t)JIT_F_ON;
#if LJ_TARGET_X86ORX64
      else if ((G2J(g)->flags & JIT_F_SSE2))
	G2J(g)->flags |= (uint32_t)JIT_F_ON;
      else
	return 0;  /* Don't turn on JIT compiler without SSE2 support. */
#else
      else
	G2J(g)->flags |= (uint32_t)JIT_F_ON;
#endif
      lj_dispatch_update(g);
    }
    break;
  case LUAJIT_MODE_FUNC:
  case LUAJIT_MODE_ALLFUNC:
  case LUAJIT_MODE_ALLSUBFUNC: {
    cTValue *tv = idx == 0 ? frame_prev(L->base-1) :
		  idx > 0 ? L->base + (idx-1) : L->top + idx;
    GCproto *pt;
    if ((idx == 0 || tvisfunc(tv)) && isluafunc(&gcval(tv)->fn))
      pt = funcproto(&gcval(tv)->fn);  /* Cannot use funcV() for frame slot. */
    else if (tvisproto(tv))
      pt = protoV(tv);
    else
      return 0;  /* Failed. */
    if (mm != LUAJIT_MODE_ALLSUBFUNC)
      setptmode(g, pt, mode);
    if (mm != LUAJIT_MODE_FUNC)
      setptmode_all(g, pt, mode);
    break;
    }
  case LUAJIT_MODE_TRACE:
    if (!(mode & LUAJIT_MODE_FLUSH))
      return 0;  /* Failed. */
    lj_trace_flush(G2J(g), idx);
    break;
#else
  case LUAJIT_MODE_ENGINE:
  case LUAJIT_MODE_FUNC:
  case LUAJIT_MODE_ALLFUNC:
  case LUAJIT_MODE_ALLSUBFUNC:
    UNUSED(idx);
    if ((mode & LUAJIT_MODE_ON))
      return 0;  /* Failed. */
    break;
#endif
  case LUAJIT_MODE_WRAPCFUNC:
    if ((mode & LUAJIT_MODE_ON)) {
      if (idx != 0) {
	cTValue *tv = idx > 0 ? L->base + (idx-1) : L->top + idx;
	if (tvislightud(tv))
	  g->wrapf = (lua_CFunction)lightudV(tv);
	else
	  return 0;  /* Failed. */
      } else {
	return 0;  /* Failed. */
      }
      g->bc_cfunc_ext = BCINS_AD(BC_FUNCCW, 0, 0);
    } else {
      g->bc_cfunc_ext = BCINS_AD(BC_FUNCC, 0, 0);
    }
    break;
  default:
    return 0;  /* Failed. */
  }
  return 1;  /* OK. */
}